

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::setOutputMemory(QPDFWriter *this)

{
  element_type *peVar1;
  Pl_Buffer *this_00;
  __shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->filename =
       "memory buffer";
  this_00 = (Pl_Buffer *)operator_new(0x38);
  Pl_Buffer::Pl_Buffer(this_00,"qpdf output",(Pipeline *)0x0);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->buffer_pipeline = this_00;
  std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Pl_Buffer,void>
            (local_30,this_00);
  std::__cxx11::list<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
  push_back(&peVar1->to_delete,(value_type *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  initializePipelineStack
            (this,&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->buffer_pipeline->super_Pipeline);
  return;
}

Assistant:

void
QPDFWriter::setOutputMemory()
{
    m->filename = "memory buffer";
    m->buffer_pipeline = new Pl_Buffer("qpdf output");
    m->to_delete.push_back(std::shared_ptr<Pipeline>(m->buffer_pipeline));
    initializePipelineStack(m->buffer_pipeline);
}